

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O2

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> __thiscall
helics::core::anon_unknown_5::makeCLITypeApp
          (anon_unknown_5 *this,string *corestring,string *namestring)

{
  HelicsConfigJSON *pHVar1;
  App *pAVar2;
  Option *pOVar3;
  allocator<char> local_243;
  allocator<char> local_242;
  allocator<char> local_241;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::make_unique<helics::helicsCLI11App,char_const(&)[20]>((char (*) [20])this);
  helicsCLI11App::remove_helics_specifics(*(helicsCLI11App **)this);
  pAVar2 = *(App **)this;
  (pAVar2->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = true;
  (pAVar2->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = true;
  pAVar2->allow_extras_ = true;
  pAVar2->allow_config_extras_ = ignore_all;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"--config-file,--config",&local_243);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_242);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Read an ini file",&local_241);
  CLI::App::set_config(pAVar2,&local_80,&local_a0,&local_240,false);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  pAVar2 = *(App **)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"--name,--identifier",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_243);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar2,&local_c0,namestring,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  pHVar1 = addJsonConfig(*(App **)this);
  (pHVar1->super_ConfigBase).maximumLayers = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"helics",(allocator<char> *)&local_240);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pHVar1->mPromoteSection,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pAVar2 = *(App **)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"network type",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"",&local_243);
  pAVar2 = &CLI::App::add_option_group<CLI::Option_group>(pAVar2,&local_100,&local_120)->super_App;
  pAVar2 = CLI::App::immediate_callback(pAVar2,true);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"--core",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"",&local_243);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar2,&local_140,corestring,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"--coretype,-t",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"",&local_243);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar2,&local_180,corestring,&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"HELICS_CORE_TYPE",&local_242);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar3->envname_,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  pAVar2 = *(App **)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"broker",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"",&local_243);
  pAVar2 = CLI::App::add_subcommand(pAVar2,&local_1c0,&local_1e0);
  pAVar2->fallthrough_ = true;
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  pAVar2 = *(App **)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"core",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_243);
  pAVar2 = CLI::App::add_subcommand(pAVar2,&local_200,&local_220);
  pAVar2->fallthrough_ = true;
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<helicsCLI11App> makeCLITypeApp(std::string& corestring, std::string& namestring)
    {
        auto app = std::make_unique<helicsCLI11App>("type extraction app");
        app->remove_helics_specifics();
        app->option_defaults()->ignore_case()->ignore_underscore();
        app->allow_config_extras(CLI::config_extras_mode::ignore_all);
        app->allow_extras();
        app->set_config("--config-file,--config", "");
        app->add_option("--name,--identifier", namestring);
        auto* fmtr = addJsonConfig(app.get());
        fmtr->maxLayers(0);
        fmtr->promoteSection("helics");
        auto* networking = app->add_option_group("network type")->immediate_callback();
        networking->add_option("--core", corestring);
        networking->add_option("--coretype,-t", corestring)->envname("HELICS_CORE_TYPE");
        app->add_subcommand("broker")->fallthrough();
        app->add_subcommand("core")->fallthrough();
        return app;
    }